

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton5.cpp
# Opt level: O1

void __thiscall Data<2U>::Data(Data<2U> *this)

{
  this->_data = 0;
  (*(code *)es::init::
            singleton<es::init::std_init,_es::init::early_initializer,_void,_std::ios_base::Init>::
            _get_instance._M_b._M_p)();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Data::ctor ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Data<2>::Data() [V = 2]",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

Data()
    {
        es::init::singleton<es::init::std_init>::instance();
        //  [[ using gnu : used ]]
        //  static auto & init /* __attribute__((used)) */ {es::init::singleton<es::init::std_init>::instance()};

        std::cout << "Data::ctor " << __PRETTY_FUNCTION__ << std::endl;
    }